

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

int cs_impl::conio::kbhit(void)

{
  uint __i;
  uint uVar1;
  long lVar2;
  timeval local_a8;
  fd_set fds;
  
  terminal_lnbuf(0);
  terminal_echo(0);
  local_a8.tv_sec = 0;
  local_a8.tv_usec = 0;
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    fds.fds_bits[lVar2] = 0;
  }
  fds.fds_bits[0]._0_4_ = (uint)fds.fds_bits[0] | 1;
  select(1,(fd_set *)&fds,(fd_set *)0x0,(fd_set *)0x0,&local_a8);
  uVar1 = (uint)fds.fds_bits[0] & 1;
  terminal_lnbuf(1);
  terminal_echo(1);
  return uVar1;
}

Assistant:

int kbhit()
		{
			fd_set fds;
			terminal_lnbuf(0);
			terminal_echo(0);
			struct timeval tv;
			tv.tv_sec = 0;
			tv.tv_usec = 0;
			FD_ZERO(&fds);
			FD_SET(0, &fds);
			select(1, &fds, 0, 0, &tv);
			int ret = FD_ISSET(0, &fds);
			terminal_lnbuf(1);
			terminal_echo(1);
			return ret;
		}